

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef find_kinit(jit_State *J,BCIns *endpc,BCReg slot,IRType t)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  TRef TVar4;
  uint *puVar5;
  double *pdVar6;
  int in_ECX;
  uint in_EDX;
  uint *in_RSI;
  long in_RDI;
  int32_t k_1;
  cTValue *tv_1;
  int32_t k;
  BCIns *target;
  BCIns *kpc;
  BCOp op;
  BCIns ins;
  BCIns *startpc;
  BCIns *pc;
  TValue tv_2;
  TValue tv;
  uint64_t in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint *local_68;
  
  puVar5 = (uint *)(*(long *)(in_RDI + 0x78) + 0x40);
  local_68 = in_RSI + -1;
  while( true ) {
    puVar2 = local_68;
    if (local_68 <= puVar5) {
      return 0;
    }
    uVar1 = *local_68;
    uVar3 = uVar1 & 0xff;
    if (((lj_bc_mode[uVar3] & 7) == 2) && ((uVar1 >> 8 & 0xff) <= in_EDX)) {
      return 0;
    }
    if (((lj_bc_mode[uVar3] & 7) == 1) && ((uVar1 >> 8 & 0xff) == in_EDX)) break;
    local_68 = local_68 + -1;
  }
  if ((uVar3 != 0x27) && (uVar3 != 0x28)) {
    return 0;
  }
  for (; puVar5 < local_68; local_68 = local_68 + -1) {
    if ((((*local_68 & 0xff) == 0x54) && (puVar2 < local_68 + ((ulong)(*local_68 >> 0x10) - 0x7fff))
        ) && (local_68 + ((ulong)(*local_68 >> 0x10) - 0x7fff) <= in_RSI)) {
      return 0;
    }
  }
  if (uVar3 == 0x27) {
    if (in_ECX == 0x13) {
      TVar4 = lj_ir_kint((jit_State *)
                         CONCAT44((int)(short)(uVar1 >> 0x10),in_stack_ffffffffffffff70),
                         (int32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      return TVar4;
    }
    TVar4 = lj_ir_knum_u64((jit_State *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff58);
    return TVar4;
  }
  pdVar6 = (double *)
           ((ulong)*(uint *)(*(long *)(in_RDI + 0x78) + 0x10) + (ulong)(uVar1 >> 0x10) * 8);
  if (in_ECX != 0x13) {
    TVar4 = lj_ir_knum_u64((jit_State *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff58);
    return TVar4;
  }
  if ((*pdVar6 == (double)(int)*pdVar6) && (!NAN(*pdVar6) && !NAN((double)(int)*pdVar6))) {
    TVar4 = lj_ir_kint((jit_State *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (int32_t)((ulong)pdVar6 >> 0x20));
    return TVar4;
  }
  return 0;
}

Assistant:

static TRef find_kinit(jit_State *J, const BCIns *endpc, BCReg slot, IRType t)
{
  /* This algorithm is rather simplistic and assumes quite a bit about
  ** how the bytecode is generated. It works fine for FORI initializers,
  ** but it won't necessarily work in other cases (e.g. iterator arguments).
  ** It doesn't do anything fancy, either (like backpropagating MOVs).
  */
  const BCIns *pc, *startpc = proto_bc(J->pt);
  for (pc = endpc-1; pc > startpc; pc--) {
    BCIns ins = *pc;
    BCOp op = bc_op(ins);
    /* First try to find the last instruction that stores to this slot. */
    if (bcmode_a(op) == BCMbase && bc_a(ins) <= slot) {
      return 0;  /* Multiple results, e.g. from a CALL or KNIL. */
    } else if (bcmode_a(op) == BCMdst && bc_a(ins) == slot) {
      if (op == BC_KSHORT || op == BC_KNUM) {  /* Found const. initializer. */
	/* Now try to verify there's no forward jump across it. */
	const BCIns *kpc = pc;
	for (; pc > startpc; pc--)
	  if (bc_op(*pc) == BC_JMP) {
	    const BCIns *target = pc+bc_j(*pc)+1;
	    if (target > kpc && target <= endpc)
	      return 0;  /* Conditional assignment. */
	  }
	if (op == BC_KSHORT) {
	  int32_t k = (int32_t)(int16_t)bc_d(ins);
	  return t == IRT_INT ? lj_ir_kint(J, k) : lj_ir_knum(J, (lua_Number)k);
	} else {
	  cTValue *tv = proto_knumtv(J->pt, bc_d(ins));
	  if (t == IRT_INT) {
	    int32_t k = numberVint(tv);
	    if (tvisint(tv) || numV(tv) == (lua_Number)k)  /* -0 is ok here. */
	      return lj_ir_kint(J, k);
	    return 0;  /* Type mismatch. */
	  } else {
	    return lj_ir_knum(J, numberVnum(tv));
	  }
	}
      }
      return 0;  /* Non-constant initializer. */
    }
  }
  return 0;  /* No assignment to this slot found? */
}